

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

JointPolicyPureVectorForClusteredBG * __thiscall
JointPolicyPureVectorForClusteredBG::operator=
          (JointPolicyPureVectorForClusteredBG *this,JointPolicyPureVectorForClusteredBG *o)

{
  if (this != o) {
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&this->_m_bg,&o->_m_bg);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::operator=
              (&this->_m_prevJPolBG,&o->_m_prevJPolBG);
    PartialJointPolicyPureVector::operator=
              (&this->super_PartialJointPolicyPureVector,&o->super_PartialJointPolicyPureVector);
  }
  return this;
}

Assistant:

JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyPureVectorForClusteredBG& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyPureVectorForClusteredBG& o) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    _m_bg = o._m_bg;
    _m_prevJPolBG = o._m_prevJPolBG;
    
    //call base class assignment:
    PartialJointPolicyPureVector::operator= ( o );
    return *this;
}